

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O2

void png_set_gray_to_rgb(png_structrp png_ptr)

{
  byte *pbVar1;
  int iVar2;
  
  iVar2 = png_rtran_ok(png_ptr,0);
  if (iVar2 != 0) {
    png_set_expand_gray_1_2_4_to_8(png_ptr);
    pbVar1 = (byte *)((long)&png_ptr->transformations + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  return;
}

Assistant:

void PNGAPI
png_set_gray_to_rgb(png_structrp png_ptr)
{
   png_debug(1, "in png_set_gray_to_rgb");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   /* Because rgb must be 8 bits or more: */
   png_set_expand_gray_1_2_4_to_8(png_ptr);
   png_ptr->transformations |= PNG_GRAY_TO_RGB;
}